

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayedDestructor.hpp
# Opt level: O2

size_t __thiscall
gmlc::concurrency::DelayedDestructor<helics::Broker>::destroyObjects
          (DelayedDestructor<helics::Broker> *this,milliseconds delay)

{
  pointer psVar1;
  pointer psVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  milliseconds delayTime;
  unique_lock<std::timed_mutex> lock;
  milliseconds minDelay;
  
  lock._M_owns = false;
  minDelay.__r = 200;
  if (200 < delay.__r) {
    minDelay.__r = delay.__r;
  }
  lock._M_device = &this->destructionLock;
  bVar3 = std::unique_lock<std::timed_mutex>::try_lock_for<long,std::ratio<1l,1000l>>
                    (&lock,&minDelay);
  if (bVar3) {
    iVar4 = 0;
    delayTime.__r = 0x32;
    if (delay.__r < 100) {
      delayTime.__r = delay.__r;
    }
    iVar5 = 1;
    if (99 < delay.__r) {
      iVar5 = (int)((ulong)delay.__r / 0x32);
    }
    sVar6 = (long)(this->ElementsToBeDestroyed).
                  super__Vector_base<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->ElementsToBeDestroyed).
                  super__Vector_base<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4;
    for (; (sVar6 != 0 && (iVar4 < iVar5)); iVar4 = iVar4 + 1) {
      if (iVar4 != 0 && 4 < delay.__r) {
        std::unique_lock<std::timed_mutex>::unlock(&lock);
        std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                  ((duration<long,_std::ratio<1L,_1000L>_> *)&delayTime);
        bVar3 = std::unique_lock<std::timed_mutex>::try_lock_for<long,std::ratio<1l,1000l>>
                          (&lock,&delayTime);
        if (!bVar3) goto LAB_0027d67b;
      }
      psVar1 = (this->ElementsToBeDestroyed).
               super__Vector_base<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      psVar2 = (this->ElementsToBeDestroyed).
               super__Vector_base<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      sVar6 = (long)psVar1 - (long)psVar2 >> 4;
      if (psVar1 != psVar2) {
        std::unique_lock<std::timed_mutex>::unlock(&lock);
        destroyObjects(this);
        bVar3 = std::unique_lock<std::timed_mutex>::try_lock_for<long,std::ratio<1l,1000l>>
                          (&lock,&delayTime);
        if (!bVar3) goto LAB_0027d67b;
      }
    }
    sVar6 = (long)(this->ElementsToBeDestroyed).
                  super__Vector_base<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->ElementsToBeDestroyed).
                  super__Vector_base<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4;
  }
  else {
    sVar6 = 0xffffffffffffffff;
  }
LAB_0027d67b:
  std::unique_lock<std::timed_mutex>::~unique_lock(&lock);
  return sVar6;
}

Assistant:

size_t destroyObjects(std::chrono::milliseconds delay)
    {
        using namespace std::literals::chrono_literals;
        std::unique_lock<std::timed_mutex> lock(destructionLock,
                                                std::defer_lock);
        auto minDelay = (delay > 200ms) ? delay : 200ms;
        if (!lock.try_lock_for(minDelay)) {
            return static_cast<size_t>(-1);
        }
        auto delayTime = (delay < 100ms) ? delay : 50ms;
        int delayCount =
            (delay < 100ms) ? 1 : static_cast<int>((delay.count() / 50));

        int cnt = 0;
        auto elementSize = ElementsToBeDestroyed.size();
        while (elementSize > 0 && (cnt < delayCount)) {
            if (cnt > 0)  // don't sleep on the first loop
            {
                if (delay > 4ms) {
                    lock.unlock();
                    std::this_thread::sleep_for(delayTime);
                    if (!lock.try_lock_for(delayTime)) {
                        return elementSize;
                    }
                }
            }
            ++cnt;
            elementSize = ElementsToBeDestroyed.size();
            if (elementSize > 0) {
                lock.unlock();
                destroyObjects();
                if (!lock.try_lock_for(delayTime)) {
                    return elementSize;
                }
            }
        }
        return ElementsToBeDestroyed.size();
    }